

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O1

int __thiscall
Potassco::BufferedStream::copy(BufferedStream *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  ulong __n;
  ulong uVar4;
  
  iVar2 = (int)src;
  if (-1 < iVar2) {
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      uVar4 = (ulong)src & 0xffffffff;
      lVar3 = 0;
      do {
        sVar1 = this->rpos_;
        if (this->buf_[sVar1] == '\0') {
          return (int)lVar3;
        }
        __n = -(sVar1 - 0x1000);
        if (uVar4 <= -(sVar1 - 0x1000)) {
          __n = uVar4;
        }
        if (sVar1 != 0x1000) {
          memmove(dst,this->buf_ + sVar1,__n);
        }
        sVar1 = this->rpos_ + __n;
        this->rpos_ = sVar1;
        if (this->buf_[sVar1] == '\0') {
          underflow(this,true);
        }
        dst = dst + __n;
        uVar4 = uVar4 - __n;
        lVar3 = lVar3 + __n;
        iVar2 = (int)lVar3;
      } while (uVar4 != 0);
    }
  }
  return iVar2;
}

Assistant:

int BufferedStream::copy(char* out, int max) {
	if (max < 0) return max;
	std::size_t os = 0;
	for (std::size_t n = static_cast<std::size_t>(max); n && peek();) {
		std::size_t b = (ALLOC_SIZE - rpos_) - 1;
		std::size_t m = std::min(n, b);
		out = std::copy(buf_ + rpos_, buf_ + rpos_ + m, out);
		n -= m;
		os += m;
		rpos_ += m;
		if (!peek()) { underflow(); }
	}
	return static_cast<int>(os);
}